

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
ON_TextureMapping::GetTextureCoordinates
          (ON_TextureMapping *this,ON_Mesh *mesh,ON_SimpleArray<ON_2fPoint> *T,ON_Xform *mesh_xform,
          bool bLazy,ON_SimpleArray<int> *Tside)

{
  int iVar1;
  uint uVar2;
  ON_TextureCoordinates *pOVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ON_SimpleArray<ON_3fPoint> T3;
  
  if ((Tside != (ON_SimpleArray<int> *)0x0) && (-1 < Tside->m_capacity)) {
    Tside->m_count = 0;
  }
  if (bLazy) {
    bVar4 = HasMatchingTextureCoordinates(this,mesh,mesh_xform);
    if (bVar4) {
      if (T->m_a == (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a) {
        return true;
      }
      ON_SimpleArray<ON_2fPoint>::operator=(T,&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
      return true;
    }
    iVar1 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    uVar2 = (mesh->m_TC).m_count;
    uVar6 = 0;
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = uVar6;
    }
    for (lVar7 = -0xa0; uVar5 * 0xb8 + lVar7 != -0xa0; lVar7 = lVar7 + -0xb8) {
      pOVar3 = (mesh->m_TC).m_a;
      if ((iVar1 == *(int *)((long)&(pOVar3->m_T).m_count + uVar6)) &&
         (bVar4 = HasMatchingTextureCoordinates
                            (this,(ON_MappingTag *)
                                  ((pOVar3->m_tag).m_mapping_id.Data4 + (uVar6 - 8)),mesh_xform),
         bVar4)) {
        ThreeToTwoHelper((ON_SimpleArray<ON_3fPoint> *)((long)(mesh->m_TC).m_a - lVar7),T);
        return true;
      }
      uVar6 = uVar6 + 0xb8;
    }
  }
  if (this->m_type == srfp_mapping) {
    bVar4 = ON_Mesh::HasSurfaceParameters(mesh);
    if (bVar4) {
      ON_SimpleArray<ON_2fPoint>::Reserve
                (T,(long)(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count);
      iVar1 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      if ((-1 < iVar1) && (iVar1 <= T->m_capacity)) {
        T->m_count = iVar1;
      }
      ON_SimpleArray<ON_2fPoint>::Zero(T);
      bVar4 = GetSPTCHelper(mesh,this,&T->m_a->x,2);
      return bVar4;
    }
    bVar4 = false;
  }
  else {
    if (-1 < T->m_capacity) {
      T->m_count = 0;
    }
    T3._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081d9d8;
    T3.m_a = (ON_3fPoint *)0x0;
    T3.m_count = 0;
    T3.m_capacity = 0;
    bVar4 = GetTextureCoordinates(this,mesh,&T3,mesh_xform,false,Tside);
    if (bVar4) {
      ThreeToTwoHelper(&T3,T);
    }
    ON_SimpleArray<ON_3fPoint>::~ON_SimpleArray(&T3);
  }
  return bVar4;
}

Assistant:

bool ON_TextureMapping::GetTextureCoordinates(
            const ON_Mesh& mesh,
            ON_SimpleArray<ON_2fPoint>& T,
            const ON_Xform* mesh_xform,
            bool bLazy,
            ON_SimpleArray<int>* Tside
            ) const
{
  bool rc = false;
  if ( Tside )
    Tside->SetCount(0);
  if ( bLazy )
  {
    if ( HasMatchingTextureCoordinates(mesh,mesh_xform ) )
    {
      if ( T.Array() != mesh.m_T.Array() )
      {
        // different arrays - copy
        T = mesh.m_T;
      }
      return true;
    }
    else
    {
      int vcnt = mesh.m_V.Count();
      int tci, tccount = mesh.m_TC.Count();
      for ( tci = 0; tci < tccount; tci++ )
      {
        if ( vcnt == mesh.m_TC[tci].m_T.Count() )
        {
          if ( HasMatchingTextureCoordinates(mesh.m_TC[tci].m_tag,mesh_xform) )
          {
            // copy T3d[] results to T[]
            ThreeToTwoHelper(mesh.m_TC[tci].m_T,T);
            return true;
          }
        }
      }
    }
  }

  if ( ON_TextureMapping::TYPE::srfp_mapping == m_type )
  {
    if (mesh.HasSurfaceParameters())
    {
      // uv textures from surface parameterization
      T.Reserve(mesh.m_V.Count());
      T.SetCount(mesh.m_V.Count());
      T.Zero();
      rc = GetSPTCHelper(mesh, *this, &T[0].x, 2);
    }
    else
    {
      //In this case, we're just going to leave the TC array in place
      rc = false;
    }
  }
  else
  {
    T.SetCount(0);
	  ON_SimpleArray<ON_3fPoint> T3;
    if ( GetTextureCoordinates(mesh, T3, mesh_xform, false, Tside ) )
    {
      // copy T3d[] results to T[]
      ThreeToTwoHelper(T3,T);
      rc = true;
	  }
  }
	return rc;
}